

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort_mkq.cpp
# Opt level: O2

bool verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_int>
               (TSTNode<unsigned_int> *node,size_t depth)

{
  TSTNode<unsigned_int> *pTVar1;
  void *pvVar2;
  void *pvVar3;
  bool bVar4;
  undefined1 uVar5;
  uint32_t in_EAX;
  long lVar6;
  size_t i;
  TSTNode<unsigned_int> *pTVar7;
  
  do {
    pTVar7 = node;
    pTVar1 = (TSTNode<unsigned_int> *)(pTVar7->buckets)._M_elems[0];
    if (((pTVar7->is_tst).super__Base_bitset<1UL>._M_w & 1) == 0) {
      if (pTVar1 != (TSTNode<unsigned_int> *)0x0) {
        pvVar2 = (pTVar1->buckets)._M_elems[1];
        pvVar3 = (pTVar1->buckets)._M_elems[0];
        lVar6 = 0;
        while ((long)pvVar2 - (long)pvVar3 >> 3 != lVar6) {
          in_EAX = get_char<unsigned_int>
                             (*(uchar **)((long)(pTVar1->buckets)._M_elems[0] + lVar6 * 8),depth);
          lVar6 = lVar6 + 1;
          if (pTVar7->pivot <= in_EAX) {
            __assert_fail("ch < node->pivot",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort_mkq.cpp"
                          ,0xb7,
                          "bool verify_bucket(TSTNode<CharT> *, size_t) [BucketNum = 0U, BucketT = std::vector<unsigned char *>, CharT = unsigned int]"
                         );
          }
        }
      }
    }
    else {
      bVar4 = verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_int>
                        (pTVar1,depth);
      in_EAX = (uint32_t)bVar4;
    }
    pTVar1 = (TSTNode<unsigned_int> *)(pTVar7->buckets)._M_elems[1];
    if (((pTVar7->is_tst).super__Base_bitset<1UL>._M_w & 2) == 0) {
      if (pTVar1 != (TSTNode<unsigned_int> *)0x0) {
        pvVar2 = (pTVar1->buckets)._M_elems[1];
        pvVar3 = (pTVar1->buckets)._M_elems[0];
        lVar6 = 0;
        while ((long)pvVar2 - (long)pvVar3 >> 3 != lVar6) {
          in_EAX = get_char<unsigned_int>
                             (*(uchar **)((long)(pTVar1->buckets)._M_elems[0] + lVar6 * 8),depth);
          lVar6 = lVar6 + 1;
          if (in_EAX != pTVar7->pivot) {
            __assert_fail("ch == node->pivot",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort_mkq.cpp"
                          ,0xbd,
                          "bool verify_bucket(TSTNode<CharT> *, size_t) [BucketNum = 1U, BucketT = std::vector<unsigned char *>, CharT = unsigned int]"
                         );
          }
        }
      }
    }
    else {
      bVar4 = verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_int>
                        (pTVar1,depth + 4);
      in_EAX = (uint32_t)bVar4;
    }
    uVar5 = (undefined1)in_EAX;
    node = (TSTNode<unsigned_int> *)(pTVar7->buckets)._M_elems[2];
    if (((pTVar7->is_tst).super__Base_bitset<1UL>._M_w & 4) == 0) {
      if (node != (TSTNode<unsigned_int> *)0x0) {
        pvVar2 = (node->buckets)._M_elems[1];
        pvVar3 = (node->buckets)._M_elems[0];
        lVar6 = 0;
        while (uVar5 = (undefined1)in_EAX, (long)pvVar2 - (long)pvVar3 >> 3 != lVar6) {
          in_EAX = get_char<unsigned_int>
                             (*(uchar **)((long)(node->buckets)._M_elems[0] + lVar6 * 8),depth);
          lVar6 = lVar6 + 1;
          if (in_EAX <= pTVar7->pivot) {
            __assert_fail("ch > node->pivot",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort_mkq.cpp"
                          ,0xc3,
                          "bool verify_bucket(TSTNode<CharT> *, size_t) [BucketNum = 2U, BucketT = std::vector<unsigned char *>, CharT = unsigned int]"
                         );
          }
        }
      }
      return (bool)uVar5;
    }
  } while( true );
}

Assistant:

static bool
verify_tst(TSTNode<CharT>* node, size_t depth)
{
	if (node->pivot)
		debug() << __func__ << "() pivot=" << node->pivot << " depth=" << depth << '\n';
	else
		debug() << __func__ << "() pivot=" << int(node->pivot) << " depth=" << depth << '\n';
	debug_indent;
	verify_bucket<0, BucketT, CharT>(node, depth);
	verify_bucket<1, BucketT, CharT>(node, depth);
	verify_bucket<2, BucketT, CharT>(node, depth);
	return true;
}